

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_rand.c
# Opt level: O1

ares_bool_t ares_init_rand_engine(ares_rand_state *state)

{
  anon_union_272_2_42d3ba2e_for_state *paVar1;
  char cVar2;
  ares_bool_t aVar3;
  ares_bool_t aVar4;
  ares_bool_t aVar5;
  int iVar6;
  FILE *__stream;
  long lVar7;
  byte bVar8;
  uchar swapByte;
  ares_bool_t aVar9;
  ares_timeval_t tv;
  ulong local_70;
  ares_bool_t local_68;
  ares_bool_t local_64;
  ares_bool_t local_60;
  ares_timeval_t local_40;
  
  state->cache_remaining = 0;
  aVar3 = state->bad_backends;
  if ((aVar3 & ARES_TRUE) == ARES_FALSE) {
    state->type = ARES_RAND_OS;
  }
  else {
    if ((aVar3 & 2) == ARES_FALSE) {
      state->type = ARES_RAND_FILE;
      __stream = fopen("/dev/urandom","rb");
      (state->state).rand_file = (FILE *)__stream;
      if (__stream != (FILE *)0x0) {
        aVar3 = setvbuf(__stream,(char *)0x0,2,0);
        return aVar3;
      }
    }
    state->type = ARES_RAND_RC4;
    paVar1 = &state->state;
    local_68 = ares_is_64bit();
    aVar3 = (ares_bool_t)((ulong)paVar1 >> 0x20);
    if (local_68 != ARES_FALSE) {
      local_68 = aVar3;
    }
    local_68 = local_68 | (ares_bool_t)paVar1;
    local_64 = ares_is_64bit();
    aVar9 = (ares_bool_t)((ulong)&local_70 >> 0x20);
    if (local_64 != ARES_FALSE) {
      local_64 = aVar9;
    }
    local_64 = local_64 | (ares_bool_t)&local_70;
    ares_tvnow(&local_40);
    local_60 = local_40.usec | (ares_bool_t)local_40.sec;
    aVar4 = ares_is_64bit();
    aVar5 = ares_is_64bit();
    if (aVar4 == ARES_FALSE) {
      aVar3 = ARES_FALSE;
    }
    if (aVar5 == ARES_FALSE) {
      aVar9 = ARES_FALSE;
    }
    srand(local_40.usec | (ares_bool_t)local_40.sec |
          (ares_bool_t)paVar1 | (ares_bool_t)&local_70 | aVar9 | aVar3);
    local_70 = 0xc;
    do {
      iVar6 = rand();
      *(char *)((long)&local_68 + local_70) = (char)iVar6;
      local_70 = local_70 + 1;
    } while (local_70 < 0x20);
    lVar7 = 0;
    do {
      *(char *)((long)paVar1 + lVar7) = (char)lVar7;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x100);
    lVar7 = 0;
    bVar8 = 0;
    do {
      cVar2 = *(char *)((long)paVar1 + lVar7);
      bVar8 = bVar8 + cVar2 + *(char *)((long)&local_68 + (ulong)((uint)lVar7 & 0x1f));
      *(undefined1 *)((long)paVar1 + lVar7) = *(undefined1 *)((long)paVar1 + (ulong)bVar8);
      *(char *)((long)paVar1 + (ulong)bVar8) = cVar2;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x100);
    (state->state).rc4.i = 0;
    (state->state).rc4.j = 0;
    aVar3 = 0x100;
  }
  return aVar3;
}

Assistant:

static ares_bool_t ares_init_rand_engine(ares_rand_state *state)
{
  state->cache_remaining = 0;

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  /* For fuzzing, random should be deterministic */
  state->bad_backends |= ARES_RAND_OS | ARES_RAND_FILE;
#endif

#if defined(HAVE_ARC4RANDOM_BUF) || defined(HAVE_GETRANDOM) || defined(_WIN32)
  if (!(state->bad_backends & ARES_RAND_OS)) {
    state->type = ARES_RAND_OS;
    return ARES_TRUE;
  }
#endif

#if defined(CARES_RANDOM_FILE)
  /* LCOV_EXCL_START: FallbackCode */
  if (!(state->bad_backends & ARES_RAND_FILE)) {
    state->type            = ARES_RAND_FILE;
    state->state.rand_file = fopen(CARES_RANDOM_FILE, "rb");
    if (state->state.rand_file) {
      setvbuf(state->state.rand_file, NULL, _IONBF, 0);
      return ARES_TRUE;
    }
  }
  /* LCOV_EXCL_STOP */

  /* Fall-Thru on failure to RC4 */
#endif

  /* LCOV_EXCL_START: FallbackCode */
  state->type = ARES_RAND_RC4;
  ares_rc4_init(&state->state.rc4);
  /* LCOV_EXCL_STOP */

  /* Currently cannot fail */
  return ARES_TRUE; /* LCOV_EXCL_LINE: UntestablePath */
}